

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus
DecodeHI32DSPRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint Reg_00;
  uint Reg;
  MCRegisterInfo *Decoder_local;
  uint64_t Address_local;
  uint RegNo_local;
  MCInst *Inst_local;
  
  if (RegNo < 4) {
    Reg_00 = getReg(Decoder,0x14,RegNo);
    MCOperand_CreateReg0(Inst,Reg_00);
    Inst_local._4_4_ = MCDisassembler_Success;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeHI32DSPRegisterClass(MCInst *Inst,
		unsigned RegNo, uint64_t Address, MCRegisterInfo *Decoder)
{
	unsigned Reg;

	if (RegNo >= 4)
		return MCDisassembler_Fail;

	Reg = getReg(Decoder, Mips_HI32DSPRegClassID, RegNo);
	MCOperand_CreateReg0(Inst, Reg);

	return MCDisassembler_Success;
}